

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O3

vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> * __thiscall
elf_parser::Elf_parser::get_sections
          (vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
           *__return_storage_ptr__,Elf_parser *this)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  Elf_parser *this_00;
  uint *puVar5;
  allocator local_c9;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> *local_c8;
  ulong local_c0;
  undefined1 local_b8 [24];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  uint local_60;
  uint local_5c;
  uint local_58;
  _Alloc_hider local_50;
  char local_40 [16];
  
  puVar2 = this->m_mmap_program;
  puVar5 = (uint *)(puVar2 + *(long *)(puVar2 + 0x28));
  local_c0 = (ulong)*(ushort *)(puVar2 + 0x3c);
  lVar3 = *(long *)(puVar5 + (ulong)*(ushort *)(puVar2 + 0x3e) * 0x10 + 6);
  (__return_storage_ptr__->
  super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = __return_storage_ptr__;
  if (local_c0 != 0) {
    uVar4 = 0;
    do {
      local_a0._M_p = (pointer)&local_90;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_80._M_p = (pointer)&local_70;
      local_78 = 0;
      local_70._M_local_buf[0] = '\0';
      local_b8._0_4_ = (undefined4)uVar4;
      std::__cxx11::string::string
                ((string *)&local_50,(char *)(puVar2 + (ulong)*puVar5 + lVar3),&local_c9);
      this_00 = (Elf_parser *)&local_50;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_50);
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      get_section_type_abi_cxx11_((string *)&local_50,this_00,puVar5[1]);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_50);
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      auVar1 = *(undefined1 (*) [16])(puVar5 + 4);
      local_b8._8_8_ = auVar1._8_8_;
      local_b8._16_4_ = auVar1._0_4_;
      local_b8._20_4_ = auVar1._4_4_;
      local_60 = puVar5[8];
      local_5c = puVar5[0xe];
      local_58 = puVar5[0xc];
      std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::push_back
                (local_c8,(value_type *)local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p);
      }
      uVar4 = uVar4 + 1;
      puVar5 = puVar5 + 0x10;
    } while (local_c0 != uVar4);
  }
  return local_c8;
}

Assistant:

std::vector<section_t> Elf_parser::get_sections() {
    Elf64_Ehdr *ehdr = (Elf64_Ehdr*)m_mmap_program;
    Elf64_Shdr *shdr = (Elf64_Shdr*)(m_mmap_program + ehdr->e_shoff);
    int shnum = ehdr->e_shnum;

    Elf64_Shdr *sh_strtab = &shdr[ehdr->e_shstrndx];
    const char *const sh_strtab_p = (char*)m_mmap_program + sh_strtab->sh_offset;

    std::vector<section_t> sections;
    for (int i = 0; i < shnum; ++i) {
        section_t section;
        section.section_index= i;
        section.section_name = std::string(sh_strtab_p + shdr[i].sh_name);
        section.section_type = get_section_type(shdr[i].sh_type);
        section.section_addr = shdr[i].sh_addr;
        section.section_offset = shdr[i].sh_offset;
        section.section_size = shdr[i].sh_size;
        section.section_ent_size = shdr[i].sh_entsize;
        section.section_addr_align = shdr[i].sh_addralign; 
        
        sections.push_back(section);
    }
    return sections;
}